

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentOnlinePlanningMDP.cpp
# Opt level: O2

Index __thiscall
AgentOnlinePlanningMDP::Act(AgentOnlinePlanningMDP *this,Index sI,Index joI,double reward)

{
  undefined1 *puVar1;
  _func_int *p_Var2;
  long *plVar3;
  int iVar4;
  Index IVar5;
  uint uVar6;
  E *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  
  if (*(long *)&(this->super_AgentFullyObservable).field_0x8 != 0) {
    p_Var2 = (this->super_AgentFullyObservable)._vptr_AgentFullyObservable[-3];
    iVar4 = (**(code **)(*(long *)((long)&(this->super_AgentFullyObservable).
                                          _vptr_AgentFullyObservable + (long)p_Var2) + 0x10))
                      ((_func_int *)
                       ((long)&(this->super_AgentFullyObservable)._vptr_AgentFullyObservable +
                       (long)p_Var2));
    plVar3 = *(long **)&(this->super_AgentFullyObservable).field_0x8;
    if (iVar4 == 0) {
      IVar5 = (**(code **)(*plVar3 + 0x18))(plVar3,sI,joI);
    }
    else {
      IVar5 = *(Index *)(plVar3 + 2);
    }
    PlanningUnitMADPDiscrete::JointToIndividualActionIndices
              (&aIs,*(PlanningUnitMADPDiscrete **)
                     (&(this->super_AgentFullyObservable).field_0x10 +
                     (long)(this->super_AgentFullyObservable)._vptr_AgentFullyObservable[-3]),IVar5)
    ;
    puVar1 = &(this->super_AgentFullyObservable).field_0x10;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    p_Var2 = (this->super_AgentFullyObservable)._vptr_AgentFullyObservable[-3];
    uVar6 = (**(code **)(*(long *)((long)&(this->super_AgentFullyObservable).
                                          _vptr_AgentFullyObservable + (long)p_Var2) + 0x10))
                      ((_func_int *)
                       ((long)&(this->super_AgentFullyObservable)._vptr_AgentFullyObservable +
                       (long)p_Var2));
    IVar5 = aIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&aIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return IVar5;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"AgentOnlinePlanningMDP::Act error, no planning module available");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

Index AgentOnlinePlanningMDP::Act(Index sI, Index joI, double reward)
{
    if(_m_planner) // only plan if online MDP planner is available
                   // Pure learners will have this set to NULL
    {
        Index jaInew;
        if(GetIndex()==0) // we only need to search for one agent, to
                          // avoid duplicate work
            jaInew=_m_planner->SearchForAction(sI, joI);
        else
            jaInew=_m_planner->GetLastActionChosen();

#if DEBUG_AgentOnlinePlanningMDP
    cout << GetIndex() << ": s " << sI
         << " ja " << jaInew << endl;
#endif

        vector<Index> aIs=GetPU()->JointToIndividualActionIndices(jaInew);

        _m_t++;

        return(aIs[GetIndex()]);
    }

    // else may still be a learner, leave Act implementation to subclass
    throw(E("AgentOnlinePlanningMDP::Act error, no planning module available"));
    return INT_MAX;
}